

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__resample_row_generic(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  psVar1 = out;
  if (0 < w) {
    uVar2 = 0;
    do {
      if (0 < hs) {
        uVar3 = 0;
        do {
          out[uVar3] = in_near[uVar2];
          uVar3 = uVar3 + 1;
        } while ((uint)hs != uVar3);
      }
      uVar2 = uVar2 + 1;
      out = out + (uint)hs;
    } while (uVar2 != (uint)w);
  }
  return psVar1;
}

Assistant:

static stbi_uc *stbi__resample_row_generic(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
    // resample with nearest-neighbor
    int i, j;
    STBI_NOTUSED(in_far);
    for (i = 0; i < w; ++i)
        for (j = 0; j < hs; ++j)
            out[i * hs + j] = in_near[i];
    return out;
}